

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocale::toString(QString *__return_storage_ptr__,QLocale *this,QTime time,FormatType format)

{
  bool bVar1;
  QSystemLocale *pQVar2;
  long in_FS_OFFSET;
  QTime time_local;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  time_local = time;
  bVar1 = QTime::isValid(&time_local);
  if (bVar1) {
    if (((this->d).d.ptr)->m_data == &systemLocaleData) {
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = systemLocale();
      ::QVariant::QVariant(&local_78,time_local);
      (*pQVar2->_vptr_QSystemLocale[2])
                (&local_58,pQVar2,(ulong)(0x14 - (format == LongFormat)),&local_78);
      ::QVariant::~QVariant(&local_78);
      bVar1 = ::QVariant::isNull((QVariant *)&local_58);
      if (!bVar1) {
        ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_58);
        ::QVariant::~QVariant((QVariant *)&local_58);
        goto LAB_002dba06;
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    timeFormat((QString *)&local_58,this,format);
    toString(__return_storage_ptr__,this,time_local,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
LAB_002dba06:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::toString(QTime time, FormatType format) const
{
    if (!time.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::TimeToStringLong
                                             : QSystemLocale::TimeToStringShort,
                                             time);
        if (!res.isNull())
            return res.toString();
    }
#endif

    QString format_str = timeFormat(format);
    return toString(time, format_str);
}